

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentSizeInitialCase::attachmentExists
          (AttachmentSizeInitialCase *this,GLenum attachment)

{
  bool bVar1;
  StateQueryMemoryWriteGuard<int> state;
  StateQueryMemoryWriteGuard<int> local_2c;
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&local_2c);
  glu::CallLogWrapper::glGetFramebufferAttachmentParameteriv
            (&(this->super_ApiCase).super_CallLogWrapper,0x8d40,attachment,0x8cd0,&local_2c.m_value)
  ;
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::isUndefined(&local_2c);
  return (bool)(~bVar1 & local_2c.m_value != 0);
}

Assistant:

bool attachmentExists (GLenum attachment)
	{
		StateQueryMemoryWriteGuard<GLint> state;
		glGetFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachment, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, &state);
		expectError(GL_NO_ERROR);

		return !state.isUndefined() && state != GL_NONE;
	}